

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_stream
               (image_u8 *dest,data_stream_serializer *serializer,uint read_flags)

{
  bool bVar1;
  data_stream *pdVar2;
  dynamic_string *other;
  undefined1 local_38 [8];
  dynamic_string ext;
  uint read_flags_local;
  data_stream_serializer *serializer_local;
  image_u8 *dest_local;
  
  if (read_flags < 2) {
    ext.m_pStr._4_4_ = read_flags;
    pdVar2 = data_stream_serializer::get_stream(serializer);
    if (pdVar2 == (data_stream *)0x0) {
      dest_local._7_1_ = false;
    }
    else {
      other = data_stream_serializer::get_name(serializer);
      dynamic_string::dynamic_string((dynamic_string *)local_38,other);
      file_utils::get_extension((dynamic_string *)local_38);
      bVar1 = dynamic_string::operator==((dynamic_string *)local_38,"jpg");
      if (((bVar1) || (bVar1 = dynamic_string::operator==((dynamic_string *)local_38,"jpeg"), bVar1)
          ) && ((ext.m_pStr._4_4_ & 1) == 0)) {
        dest_local._7_1_ = read_from_stream_jpgd(serializer,dest);
      }
      else {
        dest_local._7_1_ = read_from_stream_stb(serializer,dest);
      }
      dynamic_string::~dynamic_string((dynamic_string *)local_38);
    }
  }
  else {
    dest_local._7_1_ = false;
  }
  return dest_local._7_1_;
}

Assistant:

bool read_from_stream(image_u8& dest, data_stream_serializer& serializer, uint read_flags)
        {
            if (read_flags > cReadFlagsAllFlags)
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!serializer.get_stream())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(serializer.get_name());
            file_utils::get_extension(ext);

            if ((ext == "jpg") || (ext == "jpeg"))
            {
                // Use my jpeg decoder by default because it supports progressive jpeg's.
                if ((read_flags & cReadFlagForceSTB) == 0)
                {
                    return image_utils::read_from_stream_jpgd(serializer, dest);
                }
            }

            return image_utils::read_from_stream_stb(serializer, dest);
        }